

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O2

bool __thiscall tiger::trains::world::Train::upgrade(Train *this)

{
  int iVar1;
  ICommandSender *pIVar2;
  initializer_list<int> __l;
  allocator_type local_7d;
  int local_7c;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  UpgradeModel local_40;
  
  pIVar2 = World::getCommandSender(this->owner);
  local_7c = this->idx;
  __l._M_len = 1;
  __l._M_array = &local_7c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,__l,&local_7d);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  models::UpgradeModel::UpgradeModel
            (&local_40,(vector<int,_std::allocator<int>_> *)&local_58,
             (vector<int,_std::allocator<int>_> *)&local_78);
  iVar1 = (*pIVar2->_vptr_ICommandSender[3])(pIVar2,&local_40);
  models::UpgradeModel::~UpgradeModel(&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return SUB41(iVar1,0);
}

Assistant:

bool Train::upgrade() const
{
    return (owner->getCommandSender()->upgrade(models::UpgradeModel({idx}, {})));
}